

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void disas_simd_scalar_three_reg_same_fp16(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_ptr arg3;
  TCGv_i32 arg1;
  TCGv_i32 arg2;
  TCGv_i32 retval;
  uint uVar2;
  uintptr_t o;
  
  uVar2 = insn >> 0x19 & 0x10 | insn >> 0x14 & 8 | insn >> 0xb & 7;
  if ((0x1d < uVar2) || ((0x34308098U >> uVar2 & 1) == 0)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  tcg_ctx = s->uc->tcg_ctx;
  if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) {
    unallocated_encoding_aarch64(s);
  }
  _Var1 = fp_access_check(s);
  if (!_Var1) {
    return;
  }
  arg3 = get_fpstatus_ptr_aarch64(tcg_ctx,true);
  arg1 = read_fp_hreg(s,insn >> 5 & 0x1f);
  arg2 = read_fp_hreg(s,insn >> 0x10 & 0x1f);
  retval = tcg_temp_new_i32(tcg_ctx);
  switch(uVar2) {
  case 0xf:
    gen_helper_rsqrtsf_f16(tcg_ctx,retval,arg1,arg2,arg3);
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1b:
switchD_0063c7a4_caseD_10:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,0x256c,(char *)0x0);
  case 0x14:
    gen_helper_advsimd_cge_f16(tcg_ctx,retval,arg1,arg2,arg3);
    break;
  case 0x15:
    gen_helper_advsimd_acge_f16(tcg_ctx,retval,arg1,arg2,arg3);
    break;
  case 0x1a:
    gen_helper_advsimd_subh(tcg_ctx,retval,arg1,arg2,arg3);
    tcg_gen_andi_i32_aarch64(tcg_ctx,retval,retval,0x7fff);
    break;
  case 0x1c:
    gen_helper_advsimd_cgt_f16(tcg_ctx,retval,arg1,arg2,arg3);
    break;
  case 0x1d:
    gen_helper_advsimd_acgt_f16(tcg_ctx,retval,arg1,arg2,arg3);
    break;
  default:
    if (uVar2 == 7) {
      gen_helper_recpsf_f16(tcg_ctx,retval,arg1,arg2,arg3);
    }
    else if (uVar2 == 4) {
      gen_helper_advsimd_ceq_f16(tcg_ctx,retval,arg1,arg2,arg3);
    }
    else {
      if (uVar2 != 3) goto switchD_0063c7a4_caseD_10;
      gen_helper_advsimd_mulxh(tcg_ctx,retval,arg1,arg2,arg3);
    }
  }
  write_fp_sreg(s,insn & 0x1f,retval);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
  return;
}

Assistant:

static void disas_simd_scalar_three_reg_same_fp16(DisasContext *s,
                                                  uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 3);
    int rm = extract32(insn, 16, 5);
    bool u = extract32(insn, 29, 1);
    bool a = extract32(insn, 23, 1);
    int fpopcode = opcode | (a << 3) |  (u << 4);
    TCGv_ptr fpst;
    TCGv_i32 tcg_op1;
    TCGv_i32 tcg_op2;
    TCGv_i32 tcg_res;

    switch (fpopcode) {
    case 0x03: /* FMULX */
    case 0x04: /* FCMEQ (reg) */
    case 0x07: /* FRECPS */
    case 0x0f: /* FRSQRTS */
    case 0x14: /* FCMGE (reg) */
    case 0x15: /* FACGE */
    case 0x1a: /* FABD */
    case 0x1c: /* FCMGT (reg) */
    case 0x1d: /* FACGT */
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
    }

    if (!fp_access_check(s)) {
        return;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, true);

    tcg_op1 = read_fp_hreg(s, rn);
    tcg_op2 = read_fp_hreg(s, rm);
    tcg_res = tcg_temp_new_i32(tcg_ctx);

    switch (fpopcode) {
    case 0x03: /* FMULX */
        gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x04: /* FCMEQ (reg) */
        gen_helper_advsimd_ceq_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x07: /* FRECPS */
        gen_helper_recpsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x0f: /* FRSQRTS */
        gen_helper_rsqrtsf_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x14: /* FCMGE (reg) */
        gen_helper_advsimd_cge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x15: /* FACGE */
        gen_helper_advsimd_acge_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x1a: /* FABD */
        gen_helper_advsimd_subh(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        tcg_gen_andi_i32(tcg_ctx, tcg_res, tcg_res, 0x7fff);
        break;
    case 0x1c: /* FCMGT (reg) */
        gen_helper_advsimd_cgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    case 0x1d: /* FACGT */
        gen_helper_advsimd_acgt_f16(tcg_ctx, tcg_res, tcg_op1, tcg_op2, fpst);
        break;
    default:
        g_assert_not_reached();
    }

    write_fp_sreg(s, rd, tcg_res);


    tcg_temp_free_i32(tcg_ctx, tcg_res);
    tcg_temp_free_i32(tcg_ctx, tcg_op1);
    tcg_temp_free_i32(tcg_ctx, tcg_op2);
    tcg_temp_free_ptr(tcg_ctx, fpst);
}